

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

string * complement(string *sequence)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  string *in_RDI;
  char base;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string *complementString;
  string *__lhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38 [4];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  local_38[0]._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)__lhs,in_RSI), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_38);
    cVar1 = *pcVar3;
    if (cVar1 == 'A') {
      std::__cxx11::string::operator+=((string *)in_RDI,'T');
    }
    else if (cVar1 == 'T') {
      std::__cxx11::string::operator+=((string *)in_RDI,'A');
    }
    else if (cVar1 == 'G') {
      std::__cxx11::string::operator+=((string *)in_RDI,'C');
    }
    else if (cVar1 == 'C') {
      std::__cxx11::string::operator+=((string *)in_RDI,'G');
    }
    else {
      std::__cxx11::string::operator+=((string *)in_RDI,cVar1);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_38);
  }
  return __lhs;
}

Assistant:

string complement(string sequence)  {
    string complementString = "";
    for(char base : sequence) {
        if(base=='A'){
            complementString += 'T';
        }else if(base=='T'){
            complementString += 'A';
        }else if(base=='G'){
            complementString += 'C';
        }else if(base=='C'){
            complementString += 'G';
        }else {
            complementString += base;
        }
    }

    return complementString;
}